

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::tracker_manager::incoming_packet
          (tracker_manager *this,string_view hostname,span<const_char> buf)

{
  session_logger *psVar1;
  bool bVar2;
  type_conflict tVar3;
  iterator iVar4;
  uint32_t transaction;
  shared_ptr<libtorrent::aux::udp_tracker_connection> p;
  allocator<char> local_6d;
  type_conflict local_6c;
  __shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2> local_68 [2];
  basic_string_view<char,_std::char_traits<char>_> local_48;
  char *local_38;
  long local_30;
  
  local_30 = buf.m_len;
  local_38 = buf.m_ptr;
  local_48._M_str = hostname._M_str;
  local_48._M_len = hostname._M_len;
  if ((0xf < local_30) && (tVar3 = read_impl<unsigned_int,char_const>(), tVar3 < 4)) {
    local_6c = read_impl<unsigned_int,char_const>(&local_38);
    iVar4 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this,&local_6c);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      ::std::__shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(local_68,(__shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>
                             *)((long)iVar4.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
                                      ._M_cur + 0x10));
      bVar2 = udp_tracker_connection::on_receive_hostname(local_68[0]._M_ptr,hostname,buf);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68[0]._M_refcount);
      return bVar2;
    }
    psVar1 = this->m_ses;
    ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_68,&local_48,&local_6d);
    (*psVar1->_vptr_session_logger[1])
              (psVar1,"incoming UDP tracker packet from %s has invalid transaction ID (%x)",
               local_68[0]._M_ptr,(ulong)local_6c);
    ::std::__cxx11::string::~string((string *)local_68);
  }
  return false;
}

Assistant:

bool tracker_manager::incoming_packet(string_view const hostname
		, span<char const> const buf)
	{
		TORRENT_ASSERT(is_single_thread());
		// ignore packets smaller than 8 bytes
		if (buf.size() < 16) return false;

		// the first word is the action, if it's not [0, 3]
		// it's not a valid udp tracker response
		span<const char> ptr = buf;
		std::uint32_t const action = aux::read_uint32(ptr);
		if (action > 3) return false;

		std::uint32_t const transaction = aux::read_uint32(ptr);
		auto const i = m_udp_conns.find(transaction);

		if (i == m_udp_conns.end())
		{
#ifndef TORRENT_DISABLE_LOGGING
			// now, this may not have been meant to be a tracker response,
			// but chances are pretty good, so it's probably worth logging
			m_ses.session_log("incoming UDP tracker packet from %s has invalid "
				"transaction ID (%x)", std::string(hostname).c_str(), int(transaction));
#endif
			return false;
		}

		auto const p = i->second;
		// on_receive() may remove the tracker connection from the list
		return p->on_receive_hostname(hostname, buf);
	}